

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O0

void on_message_sender_state_changed
               (void *context,MESSAGE_SENDER_STATE new_state,MESSAGE_SENDER_STATE previous_state)

{
  LOGGER_LOG p_Var1;
  AMQP_MANAGEMENT_INSTANCE *amqp_management_instance;
  LOGGER_LOG l;
  MESSAGE_SENDER_STATE previous_state_local;
  MESSAGE_SENDER_STATE new_state_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_sender_state_changed",0x19d,1,
                "on_message_sender_state_changed called with NULL context");
    }
  }
  else if (new_state != previous_state) {
    switch(*(undefined4 *)((long)context + 0x50)) {
    case 1:
      switch(new_state) {
      default:
        *(undefined4 *)((long)context + 0x50) = 0;
        (**(code **)((long)context + 0x30))(*(undefined8 *)((long)context + 0x38),2);
        break;
      case MESSAGE_SENDER_STATE_OPENING:
        break;
      case MESSAGE_SENDER_STATE_OPEN:
        *(byte *)((long)context + 0x68) = *(byte *)((long)context + 0x68) & 0xfe | 1;
        if ((*(byte *)((long)context + 0x68) >> 1 & 1) != 0) {
          *(undefined4 *)((long)context + 0x50) = 3;
          (**(code **)((long)context + 0x30))(*(undefined8 *)((long)context + 0x38),1);
        }
      }
      break;
    case 2:
      if ((new_state != MESSAGE_SENDER_STATE_IDLE) &&
         ((new_state - MESSAGE_SENDER_STATE_OPENING < 2 ||
          (new_state != MESSAGE_SENDER_STATE_CLOSING)))) {
        *(undefined4 *)((long)context + 0x50) = 4;
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      }
      break;
    case 3:
      if ((new_state == MESSAGE_SENDER_STATE_IDLE) || (new_state != MESSAGE_SENDER_STATE_OPEN)) {
        *(undefined4 *)((long)context + 0x50) = 4;
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      }
      break;
    case 4:
    }
  }
  return;
}

Assistant:

static void on_message_sender_state_changed(void* context, MESSAGE_SENDER_STATE new_state, MESSAGE_SENDER_STATE previous_state)
{
    IOTHUBTRANSPORT_AMQP_METHODS_HANDLE amqp_methods_handle = (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)context;
    if ((new_state != previous_state) &&
        (new_state == MESSAGE_SENDER_STATE_ERROR))
    {
        amqp_methods_handle->on_methods_error(amqp_methods_handle->on_methods_error_context);
    }
    else
    {
        if ((new_state == MESSAGE_SENDER_STATE_IDLE) && (previous_state == MESSAGE_SENDER_STATE_OPEN))
        {
            amqp_methods_handle->sender_link_disconnected = true;
        }
        call_methods_unsubscribed_if_needed(amqp_methods_handle);
    }
}